

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O0

void __thiscall
t_cpp_generator::generate_consts
          (t_cpp_generator *this,vector<t_const_*,_std::allocator<t_const_*>_> *consts)

{
  bool bVar1;
  size_type sVar2;
  ostream *poVar3;
  t_program *ptVar4;
  reference pptVar5;
  t_type *type_00;
  t_const_value *value;
  int __oflag;
  int __oflag_00;
  int iVar6;
  string local_558;
  __normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_> local_538;
  t_const **local_530;
  string local_528;
  string local_508;
  t_type *local_4e8;
  t_type *type;
  string name;
  __normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_> local_4b0;
  iterator c_iter;
  string local_488;
  string local_468 [32];
  string local_448 [32];
  undefined1 local_428 [8];
  ofstream_with_content_based_conditional_update f_consts_impl;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  undefined1 local_248 [8];
  string f_consts_impl_name;
  ofstream_with_content_based_conditional_update f_consts;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  string f_consts_name;
  vector<t_const_*,_std::allocator<t_const_*>_> *consts_local;
  t_cpp_generator *this_local;
  
  f_consts_name.field_2._8_8_ = consts;
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])();
  std::operator+(&local_58,&local_78,&(this->super_t_oop_generator).super_t_generator.program_name_)
  ;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 &local_58,"_constants.h");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)((long)&f_consts_impl_name.field_2 + 8));
  sVar2 = std::vector<t_const_*,_std::allocator<t_const_*>_>::size(consts);
  if (sVar2 != 0) {
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
              ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
                *)((long)&f_consts_impl_name.field_2 + 8),local_38,__oflag);
    (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])
              (&f_consts_impl.field_0x198);
    std::operator+(&local_268,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &f_consts_impl.field_0x198,
                   &(this->super_t_oop_generator).super_t_generator.program_name_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248,
                   &local_268,"_constants.cpp");
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&f_consts_impl.field_0x198);
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
    template_ofstream_with_content_based_conditional_update
              ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
                *)local_428);
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
              ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
                *)local_428,local_248,__oflag_00);
    (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(local_448);
    std::operator<<((ostream *)((long)&f_consts_impl_name.field_2 + 8),local_448);
    std::__cxx11::string::~string(local_448);
    (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(local_468);
    std::operator<<((ostream *)local_428,local_468);
    std::__cxx11::string::~string(local_468);
    poVar3 = std::operator<<((ostream *)((long)&f_consts_impl_name.field_2 + 8),"#ifndef ");
    poVar3 = std::operator<<(poVar3,(string *)
                                    &(this->super_t_oop_generator).super_t_generator.program_name_);
    poVar3 = std::operator<<(poVar3,"_CONSTANTS_H");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,"#define ");
    poVar3 = std::operator<<(poVar3,(string *)
                                    &(this->super_t_oop_generator).super_t_generator.program_name_);
    poVar3 = std::operator<<(poVar3,"_CONSTANTS_H");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,"#include \"");
    ptVar4 = t_generator::get_program((t_generator *)this);
    get_include_prefix_abi_cxx11_(&local_488,this,ptVar4);
    poVar3 = std::operator<<(poVar3,(string *)&local_488);
    poVar3 = std::operator<<(poVar3,(string *)
                                    &(this->super_t_oop_generator).super_t_generator.program_name_);
    poVar3 = std::operator<<(poVar3,"_types.h\"");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,(string *)&this->ns_open_);
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_488);
    poVar3 = std::operator<<((ostream *)local_428,"#include \"");
    ptVar4 = t_generator::get_program((t_generator *)this);
    get_include_prefix_abi_cxx11_((string *)&c_iter,this,ptVar4);
    poVar3 = std::operator<<(poVar3,(string *)&c_iter);
    poVar3 = std::operator<<(poVar3,(string *)
                                    &(this->super_t_oop_generator).super_t_generator.program_name_);
    poVar3 = std::operator<<(poVar3,"_constants.h\"");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,(string *)&this->ns_open_);
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&c_iter);
    poVar3 = std::operator<<((ostream *)((long)&f_consts_impl_name.field_2 + 8),"class ");
    poVar3 = std::operator<<(poVar3,(string *)
                                    &(this->super_t_oop_generator).super_t_generator.program_name_);
    poVar3 = std::operator<<(poVar3,"Constants {");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    poVar3 = std::operator<<(poVar3," public:");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,"  ");
    poVar3 = std::operator<<(poVar3,(string *)
                                    &(this->super_t_oop_generator).super_t_generator.program_name_);
    poVar3 = std::operator<<(poVar3,"Constants();");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    t_generator::indent_up((t_generator *)this);
    __gnu_cxx::__normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>::
    __normal_iterator(&local_4b0);
    local_4b0._M_current =
         (t_const **)std::vector<t_const_*,_std::allocator<t_const_*>_>::begin(consts);
    while( true ) {
      name.field_2._8_8_ = std::vector<t_const_*,_std::allocator<t_const_*>_>::end(consts);
      bVar1 = __gnu_cxx::operator!=
                        (&local_4b0,
                         (__normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>
                          *)((long)&name.field_2 + 8));
      if (!bVar1) break;
      pptVar5 = __gnu_cxx::
                __normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>::
                operator*(&local_4b0);
      t_const::get_name_abi_cxx11_((string *)&type,*pptVar5);
      pptVar5 = __gnu_cxx::
                __normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>::
                operator*(&local_4b0);
      local_4e8 = t_const::get_type(*pptVar5);
      t_generator::indent_abi_cxx11_(&local_508,(t_generator *)this);
      poVar3 = std::operator<<((ostream *)((long)&f_consts_impl_name.field_2 + 8),
                               (string *)&local_508);
      type_name_abi_cxx11_(&local_528,this,local_4e8,false,false);
      poVar3 = std::operator<<(poVar3,(string *)&local_528);
      poVar3 = std::operator<<(poVar3," ");
      poVar3 = std::operator<<(poVar3,(string *)&type);
      poVar3 = std::operator<<(poVar3,";");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_528);
      std::__cxx11::string::~string((string *)&local_508);
      std::__cxx11::string::~string((string *)&type);
      __gnu_cxx::__normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>
      ::operator++(&local_4b0);
    }
    t_generator::indent_down((t_generator *)this);
    poVar3 = std::operator<<((ostream *)((long)&f_consts_impl_name.field_2 + 8),"};");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    poVar3 = std::operator<<((ostream *)local_428,"const ");
    poVar3 = std::operator<<(poVar3,(string *)
                                    &(this->super_t_oop_generator).super_t_generator.program_name_);
    poVar3 = std::operator<<(poVar3,"Constants g_");
    poVar3 = std::operator<<(poVar3,(string *)
                                    &(this->super_t_oop_generator).super_t_generator.program_name_);
    poVar3 = std::operator<<(poVar3,"_constants;");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,(string *)
                                    &(this->super_t_oop_generator).super_t_generator.program_name_);
    poVar3 = std::operator<<(poVar3,"Constants::");
    poVar3 = std::operator<<(poVar3,(string *)
                                    &(this->super_t_oop_generator).super_t_generator.program_name_);
    poVar3 = std::operator<<(poVar3,"Constants() {");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    t_generator::indent_up((t_generator *)this);
    local_530 = (t_const **)std::vector<t_const_*,_std::allocator<t_const_*>_>::begin(consts);
    local_4b0._M_current = local_530;
    while( true ) {
      local_538._M_current =
           (t_const **)std::vector<t_const_*,_std::allocator<t_const_*>_>::end(consts);
      bVar1 = __gnu_cxx::operator!=(&local_4b0,&local_538);
      if (!bVar1) break;
      pptVar5 = __gnu_cxx::
                __normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>::
                operator*(&local_4b0);
      t_const::get_name_abi_cxx11_(&local_558,*pptVar5);
      pptVar5 = __gnu_cxx::
                __normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>::
                operator*(&local_4b0);
      type_00 = t_const::get_type(*pptVar5);
      pptVar5 = __gnu_cxx::
                __normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>::
                operator*(&local_4b0);
      value = t_const::get_value(*pptVar5);
      print_const_value(this,(ostream *)local_428,&local_558,type_00,value);
      std::__cxx11::string::~string((string *)&local_558);
      __gnu_cxx::__normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>
      ::operator++(&local_4b0);
    }
    t_generator::indent_down((t_generator *)this);
    poVar3 = t_generator::indent((t_generator *)this,(ostream *)local_428);
    poVar3 = std::operator<<(poVar3,"}");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    poVar3 = std::operator<<((ostream *)((long)&f_consts_impl_name.field_2 + 8),
                             (string *)&::endl_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,"extern const ");
    poVar3 = std::operator<<(poVar3,(string *)
                                    &(this->super_t_oop_generator).super_t_generator.program_name_);
    poVar3 = std::operator<<(poVar3,"Constants g_");
    poVar3 = std::operator<<(poVar3,(string *)
                                    &(this->super_t_oop_generator).super_t_generator.program_name_);
    poVar3 = std::operator<<(poVar3,"_constants;");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,(string *)&this->ns_close_);
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,"#endif");
    iVar6 = 0x56b700;
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
              ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
                *)((long)&f_consts_impl_name.field_2 + 8),iVar6);
    poVar3 = std::operator<<((ostream *)local_428,(string *)&::endl_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,(string *)&this->ns_close_);
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    iVar6 = 0x56b700;
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
              ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
                *)local_428,iVar6);
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
    ~template_ofstream_with_content_based_conditional_update
              ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
                *)local_428);
    std::__cxx11::string::~string((string *)local_248);
  }
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)((long)&f_consts_impl_name.field_2 + 8));
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void t_cpp_generator::generate_consts(std::vector<t_const*> consts) {
  string f_consts_name = get_out_dir() + program_name_ + "_constants.h";
  ofstream_with_content_based_conditional_update f_consts;
  if (consts.size() > 0) {
    f_consts.open(f_consts_name);

    string f_consts_impl_name = get_out_dir() + program_name_ + "_constants.cpp";
    ofstream_with_content_based_conditional_update f_consts_impl;
    f_consts_impl.open(f_consts_impl_name);

    // Print header
    f_consts << autogen_comment();
    f_consts_impl << autogen_comment();

    // Start ifndef
    f_consts << "#ifndef " << program_name_ << "_CONSTANTS_H" << endl << "#define " << program_name_
             << "_CONSTANTS_H" << endl << endl << "#include \"" << get_include_prefix(*get_program())
             << program_name_ << "_types.h\"" << endl << endl << ns_open_ << endl << endl;

    f_consts_impl << "#include \"" << get_include_prefix(*get_program()) << program_name_
                  << "_constants.h\"" << endl << endl << ns_open_ << endl << endl;

    f_consts << "class " << program_name_ << "Constants {" << endl << " public:" << endl << "  "
             << program_name_ << "Constants();" << endl << endl;
    indent_up();
    vector<t_const*>::iterator c_iter;
    for (c_iter = consts.begin(); c_iter != consts.end(); ++c_iter) {
      string name = (*c_iter)->get_name();
      t_type* type = (*c_iter)->get_type();
      f_consts << indent() << type_name(type) << " " << name << ";" << endl;
    }
    indent_down();
    f_consts << "};" << endl;

    f_consts_impl << "const " << program_name_ << "Constants g_" << program_name_ << "_constants;"
                  << endl << endl << program_name_ << "Constants::" << program_name_
                  << "Constants() {" << endl;
    indent_up();
    for (c_iter = consts.begin(); c_iter != consts.end(); ++c_iter) {
      print_const_value(f_consts_impl,
                        (*c_iter)->get_name(),
                        (*c_iter)->get_type(),
                        (*c_iter)->get_value());
    }
    indent_down();
    indent(f_consts_impl) << "}" << endl;

    f_consts << endl << "extern const " << program_name_ << "Constants g_" << program_name_
             << "_constants;" << endl << endl << ns_close_ << endl << endl << "#endif" << endl;
    f_consts.close();

    f_consts_impl << endl << ns_close_ << endl << endl;
    f_consts_impl.close();
  }
}